

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScatterLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedPtrField<CoreML::Specification::Tensor> *this_00;
  int iVar1;
  uint32 uVar2;
  bool bVar3;
  Type *pTVar4;
  Result *_result;
  string sStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string err;
  
  validateInputCount(__return_storage_ptr__,layer,3,3);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  if (this->ndArrayInterpretation != true) goto LAB_002836a2;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  iVar1 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    if (iVar1 != 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_a8,"Scatter layer must have 3 input tensor fields filled",
                 (allocator<char> *)&local_88);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_a8);
LAB_002836d1:
      std::__cxx11::string::~string((string *)&sStack_a8);
LAB_0028374f:
      std::__cxx11::string::~string((string *)&err);
      return __return_storage_ptr__;
    }
    this_00 = &layer->inputtensor_;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,0);
    uVar2 = pTVar4->rank_;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,2);
    if ((uVar2 != pTVar4->rank_) ||
       (pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,1), pTVar4->rank_ != 1)) {
      std::__cxx11::string::string((string *)&local_68,(string *)(layer->name_).ptr_);
      std::operator+(&local_88,"Input ranks of Scatter layer \'",&local_68);
      std::operator+(&sStack_a8,&local_88,"\' are invalid.");
LAB_00283713:
      std::__cxx11::string::operator=((string *)&err,(string *)&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      goto LAB_0028374f;
    }
    if ((0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) &&
       (iVar1 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_, 0 < iVar1)) {
      if (iVar1 != 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_a8,"Scatter layer must have 1 output tensor fields filled",
                   (allocator<char> *)&local_88);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_a8);
        goto LAB_002836d1;
      }
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      uVar2 = pTVar4->rank_;
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
      if (uVar2 != pTVar4->rank_) {
        std::__cxx11::string::string((string *)&local_68,(string *)(layer->name_).ptr_);
        std::operator+(&local_88,"Output rank of Scatter layer \'",&local_68);
        std::operator+(&sStack_a8,&local_88,"\' does not match container input.");
        goto LAB_00283713;
      }
    }
  }
  std::__cxx11::string::~string((string *)&err);
LAB_002836a2:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScatterLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 3, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        std::string err;
        if (layer.inputtensor_size() > 0) {
            if (layer.inputtensor_size() != 3) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 3 input tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.inputtensor(2).rank() &&
                  layer.inputtensor(1).rank() == 1)) {
                err = "Input ranks of Scatter layer '" + std::string(layer.name()) + "' are invalid.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            if (layer.outputtensor_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 1 output tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.outputtensor(0).rank())) {
                err = "Output rank of Scatter layer '" + std::string(layer.name()) + "' does not match container input.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}